

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SNMPInform.cpp
# Opt level: O0

void remove_inform_from_list
               (list<InformItem_*,_std::allocator<InformItem_*>_> *list,
               function<bool_(InformItem_*)> *predicate)

{
  function<bool_(InformItem_*)> *predicate_local;
  list<InformItem_*,_std::allocator<InformItem_*>_> *list_local;
  
  std::__cxx11::list<InformItem*,std::allocator<InformItem*>>::
  remove_if<remove_inform_from_list(std::__cxx11::list<InformItem*,std::allocator<InformItem*>>&,std::function<bool(InformItem*)>)::__0>
            ((list<InformItem*,std::allocator<InformItem*>> *)list,
             (anon_class_8_1_c53f3057)predicate);
  return;
}

Assistant:

static void remove_inform_from_list(std::list<struct InformItem *> &list,
                             std::function<bool(struct InformItem *)> predicate) {
    list.remove_if([&predicate](struct InformItem* item){
        if(predicate(item)){
            delete_inform(item);
            return true;
        }
        return false;
    });
}